

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_ManDumpTests(Vec_Int_t *vTests,int nIter,char *pFileName)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  int local_34;
  int nVars;
  int v;
  int k;
  int i;
  FILE *pFile;
  char *pFileName_local;
  int nIter_local;
  Vec_Int_t *vTests_local;
  
  __stream = fopen(pFileName,"wb");
  iVar1 = Vec_IntSize(vTests);
  iVar2 = Vec_IntSize(vTests);
  if (iVar2 % nIter == 0) {
    v = 0;
    local_34 = 0;
    while (v < nIter) {
      for (nVars = 0; nVars < iVar1 / nIter; nVars = nVars + 1) {
        uVar3 = Vec_IntEntry(vTests,local_34);
        fprintf(__stream,"%d",(ulong)uVar3);
        local_34 = local_34 + 1;
      }
      v = v + 1;
      fprintf(__stream,"\n");
    }
    fclose(__stream);
    return;
  }
  __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                ,0x3b7,"void Gia_ManDumpTests(Vec_Int_t *, int, char *)");
}

Assistant:

void Gia_ManDumpTests( Vec_Int_t * vTests, int nIter, char * pFileName )
{
    FILE * pFile = fopen( pFileName, "wb" );
    int i, k, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    for ( v = i = 0; i < nIter; i++, fprintf(pFile, "\n") )
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, v++) );
    fclose( pFile );
}